

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_location(REF_NODE ref_node,REF_INT node)

{
  REF_DBL *pRVar1;
  ulong uVar2;
  
  printf("ref_node %d");
  if (((-1 < node) && (node < ref_node->max)) && (-1 < ref_node->global[(uint)node])) {
    pRVar1 = ref_node->real;
    uVar2 = (ulong)(uint)(node * 0xf);
    printf(" part %d mine %d glob %ld (%.15e,%.15e,%.15e)\n",pRVar1[uVar2],pRVar1[uVar2 + 1],
           pRVar1[uVar2 + 2],(ulong)(uint)ref_node->part[(uint)node],
           (ulong)(uint)ref_node->ref_mpi->id);
    return 0;
  }
  puts(" invalid");
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_location(REF_NODE ref_node, REF_INT node) {
  printf("ref_node %d", node);
  if (ref_node_valid(ref_node, node)) {
    printf(" part %d mine %d glob " REF_GLOB_FMT " (%.15e,%.15e,%.15e)\n",
           ref_node_part(ref_node, node), ref_mpi_rank(ref_node_mpi(ref_node)),
           ref_node_global(ref_node, node), ref_node_xyz(ref_node, 0, node),
           ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node));

  } else {
    printf(" invalid\n");
  }

  return REF_SUCCESS;
}